

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::crc_internal::CRC32::Extend(CRC32 *this,uint32_t *crc,void *bytes,size_t length)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  puVar1 = (uint *)((long)bytes + length);
  uVar6 = *crc;
  if (0xf < length) {
    uVar6 = uVar6 ^ *bytes;
    uVar7 = *(uint *)((long)bytes + 4);
    uVar10 = *(uint *)((long)bytes + 8);
    uVar9 = *(uint *)((long)bytes + 0xc);
    bytes = (void *)((long)bytes + 0x10);
    if ((long)length < 0x111) {
      uVar4 = length - 0x10;
    }
    else {
      uVar4 = length - 0x10;
      do {
        uVar6 = this->table_[3][uVar6 & 0xff] ^ *bytes ^ this->table_[2][uVar6 >> 8 & 0xff] ^
                *(uint *)((long)this->table_[1] + (ulong)(uVar6 >> 0xe & 0x3fc)) ^
                this->table_[0][uVar6 >> 0x18];
        uVar7 = this->table_[3][uVar7 & 0xff] ^ *(uint *)((long)bytes + 4) ^
                this->table_[2][uVar7 >> 8 & 0xff] ^
                *(uint *)((long)this->table_[1] + (ulong)(uVar7 >> 0xe & 0x3fc)) ^
                this->table_[0][uVar7 >> 0x18];
        uVar10 = this->table_[3][uVar10 & 0xff] ^ *(uint *)((long)bytes + 8) ^
                 this->table_[2][uVar10 >> 8 & 0xff] ^
                 *(uint *)((long)this->table_[1] + (ulong)(uVar10 >> 0xe & 0x3fc)) ^
                 this->table_[0][uVar10 >> 0x18];
        uVar9 = this->table_[3][uVar9 & 0xff] ^ *(uint *)((long)bytes + 0xc) ^
                this->table_[2][uVar9 >> 8 & 0xff] ^
                *(uint *)((long)this->table_[1] + (ulong)(uVar9 >> 0xe & 0x3fc)) ^
                this->table_[0][uVar9 >> 0x18];
        uVar6 = this->table_[3][uVar6 & 0xff] ^ *(uint *)((long)bytes + 0x10) ^
                this->table_[2][uVar6 >> 8 & 0xff] ^
                *(uint *)((long)this->table_[1] + (ulong)(uVar6 >> 0xe & 0x3fc)) ^
                this->table_[0][uVar6 >> 0x18];
        uVar7 = this->table_[3][uVar7 & 0xff] ^ *(uint *)((long)bytes + 0x14) ^
                this->table_[2][uVar7 >> 8 & 0xff] ^
                *(uint *)((long)this->table_[1] + (ulong)(uVar7 >> 0xe & 0x3fc)) ^
                this->table_[0][uVar7 >> 0x18];
        uVar10 = this->table_[3][uVar10 & 0xff] ^ *(uint *)((long)bytes + 0x18) ^
                 this->table_[2][uVar10 >> 8 & 0xff] ^
                 *(uint *)((long)this->table_[1] + (ulong)(uVar10 >> 0xe & 0x3fc)) ^
                 this->table_[0][uVar10 >> 0x18];
        uVar9 = this->table_[3][uVar9 & 0xff] ^ *(uint *)((long)bytes + 0x1c) ^
                this->table_[2][uVar9 >> 8 & 0xff] ^
                *(uint *)((long)this->table_[1] + (ulong)(uVar9 >> 0xe & 0x3fc)) ^
                this->table_[0][uVar9 >> 0x18];
        uVar6 = this->table_[3][uVar6 & 0xff] ^ *(uint *)((long)bytes + 0x20) ^
                this->table_[2][uVar6 >> 8 & 0xff] ^
                *(uint *)((long)this->table_[1] + (ulong)(uVar6 >> 0xe & 0x3fc)) ^
                this->table_[0][uVar6 >> 0x18];
        uVar7 = this->table_[3][uVar7 & 0xff] ^ *(uint *)((long)bytes + 0x24) ^
                this->table_[2][uVar7 >> 8 & 0xff] ^
                *(uint *)((long)this->table_[1] + (ulong)(uVar7 >> 0xe & 0x3fc)) ^
                this->table_[0][uVar7 >> 0x18];
        uVar10 = this->table_[3][uVar10 & 0xff] ^ *(uint *)((long)bytes + 0x28) ^
                 this->table_[2][uVar10 >> 8 & 0xff] ^
                 *(uint *)((long)this->table_[1] + (ulong)(uVar10 >> 0xe & 0x3fc)) ^
                 this->table_[0][uVar10 >> 0x18];
        uVar9 = this->table_[3][uVar9 & 0xff] ^ *(uint *)((long)bytes + 0x2c) ^
                this->table_[2][uVar9 >> 8 & 0xff] ^
                *(uint *)((long)this->table_[1] + (ulong)(uVar9 >> 0xe & 0x3fc)) ^
                this->table_[0][uVar9 >> 0x18];
        uVar6 = this->table_[3][uVar6 & 0xff] ^ *(uint *)((long)bytes + 0x30) ^
                this->table_[2][uVar6 >> 8 & 0xff] ^
                *(uint *)((long)this->table_[1] + (ulong)(uVar6 >> 0xe & 0x3fc)) ^
                this->table_[0][uVar6 >> 0x18];
        uVar7 = this->table_[3][uVar7 & 0xff] ^ *(uint *)((long)bytes + 0x34) ^
                this->table_[2][uVar7 >> 8 & 0xff] ^
                *(uint *)((long)this->table_[1] + (ulong)(uVar7 >> 0xe & 0x3fc)) ^
                this->table_[0][uVar7 >> 0x18];
        uVar10 = this->table_[3][uVar10 & 0xff] ^ *(uint *)((long)bytes + 0x38) ^
                 this->table_[2][uVar10 >> 8 & 0xff] ^
                 *(uint *)((long)this->table_[1] + (ulong)(uVar10 >> 0xe & 0x3fc)) ^
                 this->table_[0][uVar10 >> 0x18];
        uVar9 = this->table_[3][uVar9 & 0xff] ^ *(uint *)((long)bytes + 0x3c) ^
                this->table_[2][uVar9 >> 8 & 0xff] ^
                *(uint *)((long)this->table_[1] + (ulong)(uVar9 >> 0xe & 0x3fc)) ^
                this->table_[0][uVar9 >> 0x18];
        bytes = (void *)((long)bytes + 0x40);
        uVar4 = uVar4 - 0x40;
      } while (0x100 < (long)uVar4);
    }
    if (0xf < uVar4) {
      uVar4 = (long)puVar1 - (long)bytes;
      do {
        uVar6 = this->table_[3][uVar6 & 0xff] ^ *bytes ^ this->table_[2][uVar6 >> 8 & 0xff] ^
                *(uint *)((long)this->table_[1] + (ulong)(uVar6 >> 0xe & 0x3fc)) ^
                this->table_[0][uVar6 >> 0x18];
        uVar7 = this->table_[3][uVar7 & 0xff] ^ *(uint *)((long)bytes + 4) ^
                this->table_[2][uVar7 >> 8 & 0xff] ^
                *(uint *)((long)this->table_[1] + (ulong)(uVar7 >> 0xe & 0x3fc)) ^
                this->table_[0][uVar7 >> 0x18];
        uVar10 = this->table_[3][uVar10 & 0xff] ^ *(uint *)((long)bytes + 8) ^
                 this->table_[2][uVar10 >> 8 & 0xff] ^
                 *(uint *)((long)this->table_[1] + (ulong)(uVar10 >> 0xe & 0x3fc)) ^
                 this->table_[0][uVar10 >> 0x18];
        uVar9 = this->table_[3][uVar9 & 0xff] ^ *(uint *)((long)bytes + 0xc) ^
                this->table_[2][uVar9 >> 8 & 0xff] ^
                *(uint *)((long)this->table_[1] + (ulong)(uVar9 >> 0xe & 0x3fc)) ^
                this->table_[0][uVar9 >> 0x18];
        bytes = (void *)((long)bytes + 0x10);
        uVar4 = uVar4 - 0x10;
      } while (0xf < uVar4);
    }
    if (3 < uVar4) {
      uVar4 = (long)puVar1 - (long)bytes;
      uVar8 = uVar6;
      uVar2 = uVar7;
      uVar3 = uVar10;
      do {
        uVar10 = uVar9;
        uVar7 = uVar3;
        uVar6 = uVar2;
        uVar9 = this->table_[3][uVar8 & 0xff] ^ *bytes ^ this->table_[2][uVar8 >> 8 & 0xff] ^
                *(uint *)((long)this->table_[1] + (ulong)(uVar8 >> 0xe & 0x3fc)) ^
                this->table_[0][uVar8 >> 0x18];
        bytes = (void *)((long)bytes + 4);
        uVar4 = uVar4 - 4;
        uVar8 = uVar6;
        uVar2 = uVar7;
        uVar3 = uVar10;
      } while (3 < uVar4);
    }
    lVar5 = 4;
    do {
      uVar6 = uVar6 >> 8 ^ this->table0_[(ulong)uVar6 & 0xff];
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    uVar6 = uVar6 ^ uVar7;
    lVar5 = 4;
    do {
      uVar6 = uVar6 >> 8 ^ this->table0_[uVar6 & 0xff];
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    uVar6 = uVar6 ^ uVar10;
    lVar5 = 4;
    do {
      uVar6 = uVar6 >> 8 ^ this->table0_[uVar6 & 0xff];
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    uVar6 = uVar6 ^ uVar9;
    lVar5 = 4;
    do {
      uVar6 = uVar6 >> 8 ^ this->table0_[uVar6 & 0xff];
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  for (; (uint *)bytes != puVar1; bytes = (void *)((long)bytes + 1)) {
    uVar6 = uVar6 >> 8 ^ this->table0_[(uint)(byte)*bytes ^ uVar6 & 0xff];
  }
  *crc = uVar6;
  return;
}

Assistant:

void CRC32::Extend(uint32_t* crc, const void* bytes, size_t length) const {
  const uint8_t* p = static_cast<const uint8_t*>(bytes);
  const uint8_t* e = p + length;
  uint32_t l = *crc;

  auto step_one_byte = [this, &p, &l]() {
    int c = (l & 0xff) ^ *p++;
    l = this->table0_[c] ^ (l >> 8);
  };

  if (kNeedAlignedLoads) {
    // point x at first 4-byte aligned byte in string. this might be past the
    // end of the string.
    const uint8_t* x = RoundUp<4>(p);
    if (x <= e) {
      // Process bytes until finished or p is 4-byte aligned
      while (p != x) {
        step_one_byte();
      }
    }
  }

  const size_t kSwathSize = 16;
  if (static_cast<size_t>(e - p) >= kSwathSize) {
    // Load one swath of data into the operating buffers.
    uint32_t buf0 = absl::little_endian::Load32(p) ^ l;
    uint32_t buf1 = absl::little_endian::Load32(p + 4);
    uint32_t buf2 = absl::little_endian::Load32(p + 8);
    uint32_t buf3 = absl::little_endian::Load32(p + 12);
    p += kSwathSize;

    // Increment a CRC value by a "swath"; this combines the four bytes
    // starting at `ptr` and twelve zero bytes, so that four CRCs can be
    // built incrementally and combined at the end.
    const auto step_swath = [this](uint32_t crc_in, const std::uint8_t* ptr) {
      return absl::little_endian::Load32(ptr) ^
             this->table_[3][crc_in & 0xff] ^
             this->table_[2][(crc_in >> 8) & 0xff] ^
             this->table_[1][(crc_in >> 16) & 0xff] ^
             this->table_[0][crc_in >> 24];
    };

    // Run one CRC calculation step over all swaths in one 16-byte stride
    const auto step_stride = [&]() {
      buf0 = step_swath(buf0, p);
      buf1 = step_swath(buf1, p + 4);
      buf2 = step_swath(buf2, p + 8);
      buf3 = step_swath(buf3, p + 12);
      p += 16;
    };

    // Process kStride interleaved swaths through the data in parallel.
    while ((e - p) > kPrefetchHorizon) {
      PrefetchToLocalCacheNta(
          reinterpret_cast<const void*>(p + kPrefetchHorizon));
      // Process 64 bytes at a time
      step_stride();
      step_stride();
      step_stride();
      step_stride();
    }
    while (static_cast<size_t>(e - p) >= kSwathSize) {
      step_stride();
    }

    // Now advance one word at a time as far as possible. This isn't worth
    // doing if we have word-advance tables.
    while (static_cast<size_t>(e - p) >= 4) {
      buf0 = step_swath(buf0, p);
      uint32_t tmp = buf0;
      buf0 = buf1;
      buf1 = buf2;
      buf2 = buf3;
      buf3 = tmp;
      p += 4;
    }

    // Combine the results from the different swaths. This is just a CRC
    // on the data values in the bufX words.
    auto combine_one_word = [this](uint32_t crc_in, uint32_t w) {
      w ^= crc_in;
      for (size_t i = 0; i < 4; ++i) {
        w = (w >> 8) ^ this->table0_[w & 0xff];
      }
      return w;
    };

    l = combine_one_word(0, buf0);
    l = combine_one_word(l, buf1);
    l = combine_one_word(l, buf2);
    l = combine_one_word(l, buf3);
  }

  // Process the last few bytes
  while (p != e) {
    step_one_byte();
  }

  *crc = l;
}